

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::eliminate_dropout(NetOptimize *this)

{
  int iVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  pointer ppLVar3;
  pointer ppLVar4;
  Layer *pLVar5;
  int *piVar6;
  Layer *pLVar7;
  bool bVar8;
  pointer ppLVar9;
  size_t i;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int local_44;
  
  pvVar2 = (this->super_ModelWriter).layers;
  ppLVar3 = (pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppLVar4 = (pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar13 = -1;
  local_44 = 0;
  lVar10 = 0;
  do {
    if (lVar10 == (long)ppLVar3 - (long)ppLVar4 >> 3) {
      return 0;
    }
    bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[lVar10]->type,"Dropout");
    if (!bVar8) {
      pLVar5 = (((this->super_ModelWriter).layers)->
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar10];
      if ((*(float *)&pLVar5[1]._vptr_Layer == 1.0) && (!NAN(*(float *)&pLVar5[1]._vptr_Layer))) {
        iVar1 = *(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar12 = local_44;
        for (uVar11 = (ulong)iVar13; -1 < (int)uVar11; uVar11 = uVar11 - 1) {
          bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar11 & 0xffffffff]->
                                   type,"ncnnfused");
          if (!bVar8) {
            ppLVar9 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            piVar6 = (ppLVar9[uVar11 & 0xffffffff]->tops).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            if (((long)*(pointer *)
                        ((long)&(ppLVar9[uVar11 & 0xffffffff]->tops).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
                 (long)piVar6 == 4) && (*piVar6 == iVar1)) goto LAB_00167b29;
          }
          iVar12 = iVar12 + 1;
        }
        if (iVar12 != 0) {
          ppLVar9 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
LAB_00167b29:
          pLVar7 = ppLVar9[uVar11];
          fprintf(_stderr,"eliminate_dropout %s %s\n",(pLVar7->name)._M_dataplus._M_p,
                  (pLVar5->name)._M_dataplus._M_p);
          iVar1 = *(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = iVar1;
          (((this->super_ModelWriter).blobs)->
          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar1].producer = (int)uVar11;
          std::__cxx11::string::assign((char *)&pLVar5->type);
        }
      }
    }
    lVar10 = lVar10 + 1;
    local_44 = local_44 + -1;
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_dropout()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Dropout")
            continue;

        ncnn::Dropout* dropout = (ncnn::Dropout*)layers[i];
        if (dropout->scale != 1.f)
            continue;

        // Any - Dropout
        int bottom_blob_index = layers[i]->bottoms[0];

        int j = i - 1;
        for (; j >= 0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            if (layers[j]->tops.size() != 1)
                continue;

            if (layers[j]->tops[0] == bottom_blob_index)
                break;
        }

        if (j == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_dropout %s %s\n", any->name.c_str(), dropout->name.c_str());

        int top_blob_index_final = dropout->tops[0];
        any->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = j;
        dropout->type = "ncnnfused";
    }

    return 0;
}